

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O3

void __thiscall CDirectiveAlignFill::writeTempData(CDirectiveAlignFill *this,TempData *tempData)

{
  int iVar1;
  int64_t iVar2;
  char *in_R8;
  string local_38;
  
  iVar1 = *(int *)&(this->super_CAssemblerCommand).field_0x14;
  if (iVar1 == 0) {
    iVar2 = this->virtualAddress;
    tinyformat::format<long>(&local_38,".aligna 0x%08X",&this->value);
    TempData::writeLine(tempData,iVar2,&local_38);
  }
  else if (iVar1 == 2) {
    iVar2 = this->virtualAddress;
    tinyformat::format<long,signed_char>
              (&local_38,(tinyformat *)".fill 0x%08X,0x%02X",(char *)&this->value,
               (long *)&this->fillByte,in_R8);
    TempData::writeLine(tempData,iVar2,&local_38);
  }
  else {
    if (iVar1 != 1) {
      return;
    }
    iVar2 = this->virtualAddress;
    tinyformat::format<long>(&local_38,".align 0x%08X",&this->value);
    TempData::writeLine(tempData,iVar2,&local_38);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void CDirectiveAlignFill::writeTempData(TempData& tempData) const
{
	switch (mode)
	{
	case AlignVirtual:
		tempData.writeLine(virtualAddress,tfm::format(".align 0x%08X",value));
		break;
	case AlignPhysical:
		tempData.writeLine(virtualAddress, tfm::format(".aligna 0x%08X", value));
		break;
	case Fill:
		tempData.writeLine(virtualAddress,tfm::format(".fill 0x%08X,0x%02X",value,fillByte));
		break;
	}
}